

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token __thiscall slang::parsing::Lexer::lexNumericLiteral(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  double dVar3;
  Token TVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  pointer plVar7;
  size_type sVar8;
  char *pcVar9;
  int *piVar10;
  Diagnostic *this_00;
  byte bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  LiteralBase base;
  ulong in_R9;
  undefined8 unaff_R14;
  char *pcVar15;
  Info *unaff_R15;
  size_type sVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  Token TVar19;
  char c;
  optional<slang::TimeUnit> timeSuffix;
  SVInt intVal;
  bool outOfRange;
  double value;
  SmallVector<char,_40UL> floatChars;
  SmallVector<slang::logic_t,_40UL> digits;
  byte local_f3;
  _Storage<slang::TimeUnit,_true> local_f2;
  bool bStack_f1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f0;
  uint local_e8;
  ushort local_e4;
  bool local_d9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_d8;
  uint local_d0;
  byte local_cb;
  SmallVectorBase<char> local_c8 [2];
  size_type local_88;
  SmallVectorBase<slang::logic_t> local_80 [2];
  char *local_40;
  size_type sStack_38;
  
  TVar19.info = unaff_R15;
  TVar19._0_8_ = unaff_R14;
  TVar4.info = unaff_R15;
  TVar4._0_8_ = unaff_R14;
  pcVar15 = this->sourceBuffer;
  bVar17 = *pcVar15 == '1';
  if (bVar17) {
    lVar13 = 0;
    do {
      if (lVar13 == 4) {
        this->sourceBuffer = pcVar15 + 5;
        TVar19 = create<>(this,OneStep);
        break;
      }
      bVar17 = pcVar15[lVar13 + 1] == "1step"[lVar13 + 1];
      lVar13 = lVar13 + 1;
      TVar19 = TVar4;
    } while (bVar17);
  }
  if (bVar17) {
    return TVar19;
  }
  pcVar15 = this->sourceBuffer;
  cVar1 = *pcVar15;
  while (cVar1 == '0') {
    pcVar15 = pcVar15 + 1;
    this->sourceBuffer = pcVar15;
    cVar1 = *pcVar15;
  }
  pcVar2 = this->originalBegin;
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 0x28;
  local_c8[0].data_ = local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 0x28;
  do {
    sVar8 = local_80[0].len;
    plVar7 = local_80[0].data_;
    pcVar9 = this->sourceBuffer;
    if (*pcVar9 != '_') {
      bVar11 = *pcVar9 - 0x30;
      if (9 < bVar11) goto LAB_0041d828;
      local_f0.val._0_1_ = bVar11;
      SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>(local_80,(logic_t *)&local_f0);
      pcVar9 = this->sourceBuffer;
    }
    this->sourceBuffer = pcVar9 + 1;
  } while( true );
LAB_0041da82:
  if ((bool)(local_88 == 0 & (bVar17 ^ 1U))) {
    local_c8[0].len = 0;
  }
  else {
    this->sourceBuffer = this->sourceBuffer + uVar14;
    if (!bVar17) {
      local_f0.val._0_1_ = 0x31;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
    }
  }
  goto LAB_0041dabf;
LAB_0041d828:
  if (*this->sourceBuffer == '.') {
    this->sourceBuffer = this->sourceBuffer + 1;
    if (local_80[0].len == 0) {
      local_f0.val._0_1_ = 0x30;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
    }
    else {
      sVar16 = 0;
      do {
        local_f0.val._0_1_ = *(char *)(plVar7 + sVar16) + '0';
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
        sVar16 = sVar16 + 1;
      } while (sVar8 != sVar16);
    }
    local_f0.val._0_1_ = 0x2e;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
    bVar17 = false;
    do {
      pcVar9 = this->sourceBuffer;
      cVar1 = *pcVar9;
      local_f0.val._0_1_ = cVar1;
      if (cVar1 == '_') {
LAB_0041d8d3:
        this->sourceBuffer = pcVar9 + 1;
        bVar6 = true;
      }
      else {
        if ((byte)(cVar1 - 0x30U) < 10) {
          SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f0.val);
          pcVar9 = this->sourceBuffer;
          bVar17 = true;
          goto LAB_0041d8d3;
        }
        bVar6 = false;
      }
    } while (bVar6);
    if (!bVar17) {
      local_f0.val._0_1_ = 0x30;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
    }
  }
  sVar8 = local_80[0].len;
  plVar7 = local_80[0].data_;
  bStack_f1 = false;
  local_f3 = *this->sourceBuffer;
  if ((local_f3 & 0xdf) == 0x45) {
    local_88 = local_c8[0].len;
    if (local_c8[0].len == 0) {
      if (local_80[0].len == 0) {
        local_f0.val._0_1_ = 0x30;
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
      }
      else {
        sVar16 = 0;
        do {
          local_f0.val._0_1_ = *(char *)(plVar7 + sVar16) + '0';
          SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
          sVar16 = sVar16 + 1;
        } while (sVar8 != sVar16);
      }
    }
    local_f0.val._0_1_ = 0x65;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
    local_f3 = this->sourceBuffer[1];
    if ((local_f3 == 0x2d) || (uVar12 = 1, local_f3 == 0x2b)) {
      SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f3);
      local_f3 = this->sourceBuffer[2];
      uVar12 = 2;
    }
    uVar14 = (ulong)uVar12;
    bVar17 = false;
    do {
      if (local_f3 != 0x5f) {
        if (9 < (byte)(local_f3 - 0x30)) goto LAB_0041da82;
        bVar17 = true;
        SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f3);
      }
      local_f3 = this->sourceBuffer[uVar14 + 1];
      uVar14 = uVar14 + 1;
    } while( true );
  }
  _local_f2 = (_Optional_payload_base<slang::TimeUnit>)lexTimeLiteral(this);
  sVar8 = local_80[0].len;
  plVar7 = local_80[0].data_;
  if ((bStack_f1 == true) && (local_c8[0].len == 0)) {
    if (local_80[0].len == 0) {
      local_f0.val._0_1_ = 0x30;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
    }
    else {
      sVar16 = 0;
      do {
        local_f0.val._0_1_ = *(char *)(plVar7 + sVar16) + '0';
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
        sVar16 = sVar16 + 1;
      } while (sVar8 != sVar16);
    }
  }
LAB_0041dabf:
  if (local_c8[0].len == 0) {
    local_f0.val = 0;
    local_e8 = 1;
    local_e4 = 0;
    if (local_80[0].len != 0) {
      auVar18._8_4_ = (int)(local_80[0].len >> 0x20);
      auVar18._0_8_ = local_80[0].len;
      auVar18._12_4_ = 0x45300000;
      dVar3 = ceil(((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_80[0].len) - 4503599627370496.0)) *
                   3.321928094887362);
      if (dVar3 <= 16777215.0) {
        base = (LiteralBase)(long)dVar3;
      }
      else {
        this_00 = Diagnostics::add(this->diagnostics,(DiagCode)0x30003,
                                   (SourceLocation)
                                   (((long)pcVar15 - (long)pcVar2) * 0x10000000 |
                                   (ulong)((this->bufferId).id & 0xfffffff)));
        local_d8.val = 0xffffff;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&this_00->args,(long *)&local_d8.val);
        base = ~Binary;
      }
      local_40 = (char *)local_80[0].data_;
      sStack_38 = local_80[0].len;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = in_R9;
      SVInt::fromDigits((bitwidth_t)&local_d8,base,true,false,
                        (span<const_slang::logic_t,_18446744073709551615UL>)(auVar5 << 0x40));
      SVInt::operator=((SVInt *)&local_f0,(SVInt *)&local_d8);
      if (((0x40 < local_d0) || ((local_cb & 1) != 0)) && ((void *)local_d8.val != (void *)0x0)) {
        operator_delete__(local_d8.pVal);
      }
      SVInt::shrinkToFit((SVInt *)&local_f0);
    }
    TVar19 = create<slang::SVInt&>(this,IntegerLiteral,(SVInt *)&local_f0);
    if (((0x40 < local_e8) || ((local_e4 & 0x100) != 0)) && ((void *)local_f0.val != (void *)0x0)) {
      operator_delete__(local_f0.pVal);
    }
  }
  else {
    local_f0.val = local_f0.val & 0xffffffffffffff00;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f0.val);
    piVar10 = __errno_location();
    *piVar10 = 0;
    local_d8 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
               strtod(local_c8[0].data_,(char **)&local_f0.pVal);
    local_d9 = *piVar10 == 0x22;
    TVar19 = create<double&,bool&,std::optional<slang::TimeUnit>&>
                       (this,(ushort)_local_f2 >> 8 | RealLiteral,(double *)&local_d8,&local_d9,
                        (optional<slang::TimeUnit> *)&local_f2);
  }
  if (local_c8[0].data_ != local_c8[0].firstElement) {
    operator_delete(local_c8[0].data_);
  }
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return TVar19;
}

Assistant:

Token Lexer::lexNumericLiteral() {
    // have to check for the "1step" magic keyword
    static const char OneStepText[] = "1step";
    for (int i = 0; i < (int)sizeof(OneStepText) - 1; i++) {
        if (peek(i) != OneStepText[i])
            break;
        if (i == sizeof(OneStepText) - 2) {
            advance(sizeof(OneStepText) - 1);
            return create(TokenKind::OneStep);
        }
    }

    // scan past leading zeros
    while (peek() == '0')
        advance();

    // Keep track of digits as we iterate through them; convert them
    // into logic_t to pass into the SVInt parsing method. If it turns out
    // that this is actually a float, we'll go back and populate `floatChars`
    // instead. Since we expect many more ints than floats, it makes sense to
    // not waste time populating that array up front.
    size_t startOfNum = currentOffset();
    SmallVector<logic_t> digits;
    SmallVector<char> floatChars;

    while (true) {
        char c = peek();
        if (c == '_')
            advance();
        else if (!isDecimalDigit(c))
            break;
        else {
            digits.push_back(logic_t(getDigitValue(c)));
            advance();
        }
    }

    auto populateChars = [&]() {
        if (digits.empty())
            floatChars.push_back('0');
        else {
            for (auto d : digits)
                floatChars.push_back(char((char)d.value + '0'));
        }
    };

    // Check for fractional digits.
    if (peek() == '.') {
        advance();
        populateChars();
        floatChars.push_back('.');

        bool any = false;
        while (true) {
            char c = peek();
            if (c == '_')
                advance();
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                advance();
            }
        }

        if (!any)
            floatChars.push_back('0');
    }

    // Check for an exponent. Note that this case can be indistinguishable from
    // the vector digits for a hex literal, so we can't issue any errors here if
    // we don't have a decimal point (from above).
    //
    // Consider this nasty case we need to support:
    // `FOO 3e+2
    // If `FOO is defined to be 'h this represents an expression: 62 + 2
    // Otherwise, this represents a real literal: 300.0

    std::optional<TimeUnit> timeSuffix;
    char c = peek();
    if (c == 'e' || c == 'E') {
        bool hasDecimal = !floatChars.empty();
        if (!hasDecimal)
            populateChars();

        floatChars.push_back('e');

        // skip over leading sign
        int index = 1;
        c = peek(index);
        if (c == '+' || c == '-') {
            floatChars.push_back(c);
            c = peek(++index);
        }

        bool any = false;
        while (true) {
            if (c == '_')
                c = peek(++index);
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                c = peek(++index);
            }
        }

        if (any || hasDecimal) {
            advance(index);
            if (!any)
                floatChars.push_back('1');
        }
        else {
            // This isn't a float, it's probably a hex literal. Back up (by not calling advance)
            // and clear out the floatChars array so we don't think it should be a float.
            floatChars.clear();
        }
    }
    else {
        // Check for a time literal suffix directly adjacent. Time literal
        // values are always interpreted as doubles.
        timeSuffix = lexTimeLiteral();
        if (timeSuffix && floatChars.empty())
            populateChars();
    }

    if (!floatChars.empty()) {
        // We have a floating point result. Let the standard library do the heavy lifting of
        // converting and rounding correctly. Note that we depend on this code returning
        // 0 for underflow and +inf for overflow.
        floatChars.push_back('\0');

        char* end;
        errno = 0;
        double value = strtod(floatChars.data(), &end);
        SLANG_ASSERT(end == floatChars.end() - 1); // should never error

        // If we had an overflow or underflow, errno is now ERANGE. We can't warn here in case
        // this turns out to actually be a hex literal. Have the token carry this info so someone
        // can check it later if they care.
        bool outOfRange = errno == ERANGE;

        return create(timeSuffix ? TokenKind::TimeLiteral : TokenKind::RealLiteral, value,
                      outOfRange, timeSuffix);
    }

    // normal numeric literal
    SVInt intVal;
    if (!digits.empty()) {
        double bitsDbl = ceil(BitsPerDecimal * double(digits.size()));
        bitwidth_t bits;
        if (bitsDbl <= double(SVInt::MAX_BITS))
            bits = (bitwidth_t)bitsDbl;
        else {
            addDiag(diag::LiteralSizeTooLarge, startOfNum) << (int)SVInt::MAX_BITS;
            bits = SVInt::MAX_BITS;
        }

        intVal = SVInt::fromDigits(bits, LiteralBase::Decimal, false, false, digits);
        intVal.shrinkToFit();
    }

    return create(TokenKind::IntegerLiteral, intVal);
}